

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

void Omega_h::inject_map(LOs *a2b,Write<int> *b2a)

{
  Alloc *pAVar1;
  ulong uVar2;
  uint uVar3;
  size_t sVar4;
  type functor;
  type f2;
  Write<int> WStack_78;
  Write<int> local_68;
  Write<int> local_58;
  Write<int> local_48;
  Write<int> local_38;
  Write<int> local_28;
  
  Write<int>::Write(&WStack_78,b2a);
  Write<int>::Write(&local_68,&a2b->write_);
  pAVar1 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar4 = pAVar1->size;
  }
  else {
    sVar4 = (ulong)pAVar1 >> 3;
  }
  Write<int>::Write(&local_58,&WStack_78);
  Write<int>::Write(&local_48,&local_68);
  uVar3 = (uint)(sVar4 >> 2);
  if (0 < (int)uVar3) {
    entering_parallel = 1;
    Write<int>::Write(&local_38,&local_58);
    Write<int>::Write(&local_28,&local_48);
    entering_parallel = 0;
    for (uVar2 = 0; (uVar3 & 0x7fffffff) != uVar2; uVar2 = uVar2 + 1) {
      *(int *)((long)local_38.shared_alloc_.direct_ptr +
              (long)*(int *)((long)local_28.shared_alloc_.direct_ptr + uVar2 * 4) * 4) = (int)uVar2;
    }
    inject_map(Omega_h::Read<int>,Omega_h::Write<int>)::$_0::~__0((__0 *)&local_38);
  }
  inject_map(Omega_h::Read<int>,Omega_h::Write<int>)::$_0::~__0((__0 *)&local_58);
  inject_map(Omega_h::Read<int>,Omega_h::Write<int>)::$_0::~__0((__0 *)&WStack_78);
  return;
}

Assistant:

void inject_map(LOs a2b, Write<LO> b2a) {
  auto functor = OMEGA_H_LAMBDA(LO a) { b2a[a2b[a]] = a; };
  parallel_for("inject_map", a2b.size(), std::move(functor));
}